

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedBlackTree.cpp
# Opt level: O3

Node * __thiscall RedBlackTree::deleteBST(RedBlackTree *this,Node **root,int data)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  long lVar4;
  Node *pNVar5;
  
  pNVar3 = *root;
  do {
    if (pNVar3 == (Node *)0x0) {
      return (Node *)0x0;
    }
    while( true ) {
      lVar4 = 8;
      if ((data < pNVar3->value) || (lVar4 = 0x10, pNVar3->value < data)) break;
      if (pNVar3->left == (Node *)0x0) {
        return pNVar3;
      }
      pNVar1 = pNVar3->right;
      pNVar2 = pNVar1;
      if (pNVar1 == (Node *)0x0) {
        return pNVar3;
      }
      do {
        pNVar5 = pNVar2;
        pNVar2 = pNVar5->left;
      } while (pNVar2 != (Node *)0x0);
      data = pNVar5->value;
      pNVar3->value = data;
      pNVar3 = pNVar1;
    }
    pNVar3 = *(Node **)((long)&pNVar3->value + lVar4);
  } while( true );
}

Assistant:

RedBlackTree::Node *RedBlackTree::deleteBST(Node *&root, int data) {
    if (root == nullptr) {
        return root;
    }

    if (data < root->value) {
        return deleteBST(root->left, data);
    }

    if (data > root->value) {
        return deleteBST(root->right, data);
    }

    if (root->left == nullptr || root->right == nullptr) {
        return root;
    }

    Node *temp = findMin(root->right);
    root->value = temp->value;
    return deleteBST(root->right, temp->value);
}